

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<QSslCertificate>::emplace<QSslCertificate_const&>
          (QMovableArrayOps<QSslCertificate> *this,qsizetype i,QSslCertificate *args)

{
  undefined1 uVar1;
  uint uVar2;
  qsizetype qVar3;
  QSslCertificate *pQVar4;
  Inserter *in_RDX;
  QSslCertificate *in_RSI;
  Inserter *in_RDI;
  long in_FS_OFFSET;
  bool bVar5;
  GrowthPosition pos;
  bool growsAtBegin;
  bool detach;
  QSslCertificate tmp;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 uVar6;
  undefined4 in_stack_ffffffffffffffa8;
  undefined2 in_stack_ffffffffffffffac;
  undefined1 in_stack_ffffffffffffffae;
  byte bVar7;
  Inserter *this_00;
  QSslCertificate local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  uVar1 = QArrayDataPointer<QSslCertificate>::needsDetach
                    ((QArrayDataPointer<QSslCertificate> *)in_RDI);
  if (!(bool)uVar1) {
    if ((in_RSI == in_RDI->displaceTo) &&
       (qVar3 = QArrayDataPointer<QSslCertificate>::freeSpaceAtEnd
                          ((QArrayDataPointer<QSslCertificate> *)
                           CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffffae,
                                                   CONCAT24(in_stack_ffffffffffffffac,
                                                            in_stack_ffffffffffffffa8)))),
       qVar3 != 0)) {
      pQVar4 = QArrayDataPointer<QSslCertificate>::end((QArrayDataPointer<QSslCertificate> *)in_RDI)
      ;
      QSslCertificate::QSslCertificate(pQVar4,(QSslCertificate *)in_RDX);
      in_RDI->displaceTo = (QSslCertificate *)((long)&(in_RDI->displaceTo->d).d.ptr + 1);
      goto LAB_00115f8a;
    }
    if ((in_RSI == (QSslCertificate *)0x0) &&
       (qVar3 = QArrayDataPointer<QSslCertificate>::freeSpaceAtBegin
                          ((QArrayDataPointer<QSslCertificate> *)
                           CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffffae,
                                                   CONCAT24(in_stack_ffffffffffffffac,
                                                            in_stack_ffffffffffffffa8)))),
       qVar3 != 0)) {
      pQVar4 = QArrayDataPointer<QSslCertificate>::begin
                         ((QArrayDataPointer<QSslCertificate> *)0x115e64);
      QSslCertificate::QSslCertificate(pQVar4 + -1,(QSslCertificate *)in_RDX);
      in_RDI->displaceFrom = in_RDI->displaceFrom + -1;
      in_RDI->displaceTo = (QSslCertificate *)((long)&(in_RDI->displaceTo->d).d.ptr + 1);
      goto LAB_00115f8a;
    }
  }
  local_10.d.d.ptr =
       (QExplicitlySharedDataPointer<QSslCertificatePrivate>)
       (totally_ordered_wrapper<QSslCertificatePrivate_*>)0xaaaaaaaaaaaaaaaa;
  QSslCertificate::QSslCertificate(&local_10,(QSslCertificate *)in_RDX);
  bVar5 = in_RDI->displaceTo != (QSslCertificate *)0x0;
  uVar6 = bVar5 && in_RSI == (QSslCertificate *)0x0;
  uVar2 = (uint)(bVar5 && in_RSI == (QSslCertificate *)0x0);
  bVar7 = uVar6;
  QArrayDataPointer<QSslCertificate>::detachAndGrow
            ((QArrayDataPointer<QSslCertificate> *)this_00,(GrowthPosition)((ulong)in_RSI >> 0x20),
             (qsizetype)in_RDX,
             (QSslCertificate **)
             CONCAT17(uVar1,CONCAT16(uVar6,CONCAT24(in_stack_ffffffffffffffac,uVar2))),
             (QArrayDataPointer<QSslCertificate> *)in_RDI);
  if ((bVar7 & 1) == 0) {
    Inserter::Inserter(in_RDX,(QArrayDataPointer<QSslCertificate> *)
                              CONCAT17(uVar1,CONCAT16(bVar7,CONCAT24(in_stack_ffffffffffffffac,uVar2
                                                                    ))),(qsizetype)in_RDI,
                       CONCAT17(uVar6,in_stack_ffffffffffffff98));
    Inserter::insertOne(in_RDI,(QSslCertificate *)CONCAT17(uVar6,in_stack_ffffffffffffff98));
    Inserter::~Inserter(in_RDI);
  }
  else {
    QArrayDataPointer<QSslCertificate>::begin((QArrayDataPointer<QSslCertificate> *)0x115f1e);
    QSslCertificate::QSslCertificate
              ((QSslCertificate *)in_RDI,
               (QSslCertificate *)CONCAT17(uVar6,in_stack_ffffffffffffff98));
    in_RDI->displaceFrom = in_RDI->displaceFrom + -1;
    in_RDI->displaceTo = (QSslCertificate *)((long)&(in_RDI->displaceTo->d).d.ptr + 1);
  }
  QSslCertificate::~QSslCertificate(&local_10);
LAB_00115f8a:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }